

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  Ref<embree::Geometry> *pRVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  Scene *pSVar34;
  ulong *puVar35;
  RTCIntersectArguments *pRVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar68 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  undefined4 uVar91;
  float fVar92;
  undefined1 auVar93 [16];
  undefined8 uVar94;
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [32];
  undefined1 in_ZMM29 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_15ec;
  Scene *local_15e8;
  RayQueryContext *local_15e0;
  RTCIntersectArguments *local_15d8;
  Geometry *local_15d0;
  long local_15c8;
  undefined4 local_15c0;
  undefined4 local_15bc;
  undefined4 local_15b8;
  undefined4 local_15b4;
  undefined4 local_15b0;
  undefined4 local_15ac;
  uint local_15a8;
  uint local_15a4;
  uint local_15a0;
  RTCFilterFunctionNArguments local_1590;
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  uint uStack_1304;
  byte local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  undefined1 local_1240 [32];
  undefined1 local_1220;
  ulong local_1200 [570];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    fVar101 = ray->tfar;
    vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar62 = vucomiss_avx512f(ZEXT416((uint)fVar101));
    auVar120 = ZEXT1664(auVar62);
    if (local_1200[0] < 9) {
      local_15e0 = context;
      aVar8 = (ray->dir).field_0;
      auVar38 = vmaxss_avx512f(auVar62,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar39._8_4_ = 0x7fffffff;
      auVar39._0_8_ = 0x7fffffff7fffffff;
      auVar39._12_4_ = 0x7fffffff;
      auVar39 = vandps_avx512vl((undefined1  [16])aVar8,auVar39);
      auVar40._8_4_ = 0x219392ef;
      auVar40._0_8_ = 0x219392ef219392ef;
      auVar40._12_4_ = 0x219392ef;
      uVar30 = vcmpps_avx512vl(auVar39,auVar40,1);
      auVar60._8_4_ = 0x3f800000;
      auVar60._0_8_ = 0x3f8000003f800000;
      auVar60._12_4_ = 0x3f800000;
      puVar35 = local_1200 + 1;
      auVar39 = vdivps_avx(auVar60,(undefined1  [16])aVar8);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar14 = (bool)((byte)uVar30 & 1);
      auVar47._0_4_ = (uint)bVar14 * auVar40._0_4_ | (uint)!bVar14 * auVar39._0_4_;
      bVar14 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar47._4_4_ = (uint)bVar14 * auVar40._4_4_ | (uint)!bVar14 * auVar39._4_4_;
      bVar14 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar47._8_4_ = (uint)bVar14 * auVar40._8_4_ | (uint)!bVar14 * auVar39._8_4_;
      bVar14 = (bool)((byte)(uVar30 >> 3) & 1);
      auVar47._12_4_ = (uint)bVar14 * auVar40._12_4_ | (uint)!bVar14 * auVar39._12_4_;
      auVar41._8_4_ = 0x3f7ffffa;
      auVar41._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar41._12_4_ = 0x3f7ffffa;
      vmulps_avx512vl(auVar47,auVar41);
      auVar55._8_4_ = 0x3f800003;
      auVar55._0_8_ = 0x3f8000033f800003;
      auVar55._12_4_ = 0x3f800003;
      auVar41 = vmulps_avx512vl(auVar47,auVar55);
      auVar65 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar121 = ZEXT3264(auVar65);
      auVar65 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar122 = ZEXT3264(auVar65);
      uVar91 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1420._4_4_ = uVar91;
      local_1420._0_4_ = uVar91;
      local_1420._8_4_ = uVar91;
      local_1420._12_4_ = uVar91;
      local_1420._16_4_ = uVar91;
      local_1420._20_4_ = uVar91;
      local_1420._24_4_ = uVar91;
      local_1420._28_4_ = uVar91;
      auVar100 = ZEXT3264(local_1420);
      auVar40 = vucomiss_avx512f(auVar62);
      fVar92 = auVar40._0_4_;
      auVar39 = vmovshdup_avx(auVar40);
      uVar94 = auVar39._0_8_;
      local_1460._8_8_ = uVar94;
      local_1460._0_8_ = uVar94;
      local_1460._16_8_ = uVar94;
      local_1460._24_8_ = uVar94;
      auVar108 = ZEXT3264(local_1460);
      vshufpd_avx(auVar40,auVar40,1);
      auVar66._8_4_ = 2;
      auVar66._0_8_ = 0x200000002;
      auVar66._12_4_ = 2;
      auVar66._16_4_ = 2;
      auVar66._20_4_ = 2;
      auVar66._24_4_ = 2;
      auVar66._28_4_ = 2;
      local_1480 = vpermps_avx2(auVar66,ZEXT1632(auVar40));
      auVar110 = ZEXT3264(local_1480);
      fVar90 = auVar41._0_4_;
      auVar65._8_4_ = 1;
      auVar65._0_8_ = 0x100000001;
      auVar65._12_4_ = 1;
      auVar65._16_4_ = 1;
      auVar65._20_4_ = 1;
      auVar65._24_4_ = 1;
      auVar65._28_4_ = 1;
      local_14c0 = vpermps_avx2(auVar65,ZEXT1632(auVar41));
      auVar117 = ZEXT3264(local_14c0);
      local_14e0 = vpermps_avx2(auVar66,ZEXT1632(auVar41));
      auVar99 = ZEXT3264(local_14e0);
      vucomiss_avx512f(auVar62);
      vucomiss_avx512f(auVar62);
      uVar91 = auVar38._0_4_;
      local_1500._4_4_ = uVar91;
      local_1500._0_4_ = uVar91;
      local_1500._8_4_ = uVar91;
      local_1500._12_4_ = uVar91;
      local_1500._16_4_ = uVar91;
      local_1500._20_4_ = uVar91;
      local_1500._24_4_ = uVar91;
      local_1500._28_4_ = uVar91;
      auVar96 = ZEXT3264(local_1500);
      local_1520._4_4_ = fVar101;
      local_1520._0_4_ = fVar101;
      local_1520._8_4_ = fVar101;
      local_1520._12_4_ = fVar101;
      local_1520._16_4_ = fVar101;
      local_1520._20_4_ = fVar101;
      local_1520._24_4_ = fVar101;
      local_1520._28_4_ = fVar101;
      auVar118 = ZEXT3264(local_1520);
      local_1440 = fVar92;
      fStack_143c = fVar92;
      fStack_1438 = fVar92;
      fStack_1434 = fVar92;
      fStack_1430 = fVar92;
      fStack_142c = fVar92;
      fStack_1428 = fVar92;
      fStack_1424 = fVar92;
      local_14a0 = fVar90;
      fStack_149c = fVar90;
      fStack_1498 = fVar90;
      fStack_1494 = fVar90;
      fStack_1490 = fVar90;
      fStack_148c = fVar90;
      fStack_1488 = fVar90;
      fStack_1484 = fVar90;
      fVar101 = fVar92;
      fVar102 = fVar92;
      fVar103 = fVar92;
      fVar104 = fVar92;
      fVar105 = fVar92;
      fVar106 = fVar92;
      fVar111 = fVar90;
      fVar112 = fVar90;
      fVar113 = fVar90;
      fVar114 = fVar90;
      fVar115 = fVar90;
      fVar116 = fVar90;
LAB_01c72e74:
      if (puVar35 != local_1200) {
        uVar30 = puVar35[-1];
        puVar35 = puVar35 + -1;
        do {
          uVar91 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
          auVar71._4_4_ = uVar91;
          auVar71._0_4_ = uVar91;
          auVar71._8_4_ = uVar91;
          auVar71._12_4_ = uVar91;
          auVar71._16_4_ = uVar91;
          auVar71._20_4_ = uVar91;
          auVar71._24_4_ = uVar91;
          auVar71._28_4_ = uVar91;
          do {
            if ((uVar30 & 8) != 0) {
              local_15c8 = (ulong)((uint)uVar30 & 0xf) - 8;
              uVar30 = uVar30 & 0xfffffffffffffff0;
              lVar33 = 0;
              goto LAB_01c73001;
            }
            uVar24 = uVar30 & 0xfffffffffffffff0;
            auVar62 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100),auVar71,
                                      *(undefined1 (*) [32])(uVar24 + 0x40));
            auVar65 = vsubps_avx512vl(ZEXT1632(auVar62),auVar121._0_32_);
            auVar68._4_4_ = fVar101 * auVar65._4_4_;
            auVar68._0_4_ = fVar92 * auVar65._0_4_;
            auVar68._8_4_ = fVar102 * auVar65._8_4_;
            auVar68._12_4_ = fVar103 * auVar65._12_4_;
            auVar68._16_4_ = fVar104 * auVar65._16_4_;
            auVar68._20_4_ = fVar105 * auVar65._20_4_;
            auVar68._24_4_ = fVar106 * auVar65._24_4_;
            auVar68._28_4_ = auVar65._28_4_;
            auVar65 = vmaxps_avx(auVar96._0_32_,auVar68);
            auVar62 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x140),auVar71,
                                      *(undefined1 (*) [32])(uVar24 + 0x80));
            auVar66 = vsubps_avx512vl(ZEXT1632(auVar62),auVar122._0_32_);
            auVar17._4_4_ = auVar108._4_4_ * auVar66._4_4_;
            auVar17._0_4_ = auVar108._0_4_ * auVar66._0_4_;
            auVar17._8_4_ = auVar108._8_4_ * auVar66._8_4_;
            auVar17._12_4_ = auVar108._12_4_ * auVar66._12_4_;
            auVar17._16_4_ = auVar108._16_4_ * auVar66._16_4_;
            auVar17._20_4_ = auVar108._20_4_ * auVar66._20_4_;
            auVar17._24_4_ = auVar108._24_4_ * auVar66._24_4_;
            auVar17._28_4_ = auVar66._28_4_;
            auVar62 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x180),auVar71,
                                      *(undefined1 (*) [32])(uVar24 + 0xc0));
            auVar66 = vsubps_avx(ZEXT1632(auVar62),auVar100._0_32_);
            auVar18._4_4_ = auVar110._4_4_ * auVar66._4_4_;
            auVar18._0_4_ = auVar110._0_4_ * auVar66._0_4_;
            auVar18._8_4_ = auVar110._8_4_ * auVar66._8_4_;
            auVar18._12_4_ = auVar110._12_4_ * auVar66._12_4_;
            auVar18._16_4_ = auVar110._16_4_ * auVar66._16_4_;
            auVar18._20_4_ = auVar110._20_4_ * auVar66._20_4_;
            auVar18._24_4_ = auVar110._24_4_ * auVar66._24_4_;
            auVar18._28_4_ = auVar66._28_4_;
            auVar66 = vmaxps_avx(auVar17,auVar18);
            auVar65 = vmaxps_avx(auVar65,auVar66);
            auVar62 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x120),auVar71,
                                      *(undefined1 (*) [32])(uVar24 + 0x60));
            auVar66 = vsubps_avx512vl(ZEXT1632(auVar62),auVar121._0_32_);
            auVar19._4_4_ = fVar111 * auVar66._4_4_;
            auVar19._0_4_ = fVar90 * auVar66._0_4_;
            auVar19._8_4_ = fVar112 * auVar66._8_4_;
            auVar19._12_4_ = fVar113 * auVar66._12_4_;
            auVar19._16_4_ = fVar114 * auVar66._16_4_;
            auVar19._20_4_ = fVar115 * auVar66._20_4_;
            auVar19._24_4_ = fVar116 * auVar66._24_4_;
            auVar19._28_4_ = auVar66._28_4_;
            auVar66 = vminps_avx(auVar118._0_32_,auVar19);
            auVar62 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x160),auVar71,
                                      *(undefined1 (*) [32])(uVar24 + 0xa0));
            auVar67 = vsubps_avx512vl(ZEXT1632(auVar62),auVar122._0_32_);
            auVar20._4_4_ = auVar117._4_4_ * auVar67._4_4_;
            auVar20._0_4_ = auVar117._0_4_ * auVar67._0_4_;
            auVar20._8_4_ = auVar117._8_4_ * auVar67._8_4_;
            auVar20._12_4_ = auVar117._12_4_ * auVar67._12_4_;
            auVar20._16_4_ = auVar117._16_4_ * auVar67._16_4_;
            auVar20._20_4_ = auVar117._20_4_ * auVar67._20_4_;
            auVar20._24_4_ = auVar117._24_4_ * auVar67._24_4_;
            auVar20._28_4_ = auVar67._28_4_;
            auVar62 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x1a0),auVar71,
                                      *(undefined1 (*) [32])(uVar24 + 0xe0));
            auVar67 = vsubps_avx(ZEXT1632(auVar62),auVar100._0_32_);
            auVar21._4_4_ = auVar99._4_4_ * auVar67._4_4_;
            auVar21._0_4_ = auVar99._0_4_ * auVar67._0_4_;
            auVar21._8_4_ = auVar99._8_4_ * auVar67._8_4_;
            auVar21._12_4_ = auVar99._12_4_ * auVar67._12_4_;
            auVar21._16_4_ = auVar99._16_4_ * auVar67._16_4_;
            auVar21._20_4_ = auVar99._20_4_ * auVar67._20_4_;
            auVar21._24_4_ = auVar99._24_4_ * auVar67._24_4_;
            auVar21._28_4_ = auVar67._28_4_;
            auVar67 = vminps_avx(auVar20,auVar21);
            auVar66 = vminps_avx(auVar66,auVar67);
            if (((uint)uVar30 & 7) == 6) {
              uVar94 = vcmpps_avx512vl(auVar65,auVar66,2);
              uVar15 = vcmpps_avx512vl(auVar71,*(undefined1 (*) [32])(uVar24 + 0x1c0),0xd);
              uVar16 = vcmpps_avx512vl(auVar71,*(undefined1 (*) [32])(uVar24 + 0x1e0),1);
              uVar26 = (uint)uVar94 & (uint)uVar15 & (uint)uVar16;
            }
            else {
              uVar94 = vcmpps_avx512vl(auVar65,auVar66,2);
              uVar26 = (uint)uVar94;
            }
            if ((byte)uVar26 == 0) goto LAB_01c72e74;
            lVar33 = 0;
            for (uVar30 = (ulong)(byte)uVar26; (uVar30 & 1) == 0;
                uVar30 = uVar30 >> 1 | 0x8000000000000000) {
              lVar33 = lVar33 + 1;
            }
            uVar30 = *(ulong *)(uVar24 + lVar33 * 8);
            uVar26 = (uVar26 & 0xff) - 1 & uVar26 & 0xff;
            uVar27 = (ulong)uVar26;
          } while (uVar26 == 0);
          do {
            *puVar35 = uVar30;
            puVar35 = puVar35 + 1;
            lVar33 = 0;
            for (uVar30 = uVar27; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
              lVar33 = lVar33 + 1;
            }
            uVar27 = uVar27 - 1 & uVar27;
            uVar30 = *(ulong *)(uVar24 + lVar33 * 8);
          } while (uVar27 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_01c73001:
  if (lVar33 == local_15c8) goto LAB_01c72e74;
  lVar31 = lVar33 * 0x60;
  pSVar34 = local_15e0->scene;
  local_15e8 = pSVar34;
  pRVar9 = (pSVar34->geometries).items;
  pGVar10 = pRVar9[*(uint *)(uVar30 + 0x40 + lVar31)].ptr;
  fVar101 = (pGVar10->time_range).lower;
  fVar101 = pGVar10->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar101) / ((pGVar10->time_range).upper - fVar101));
  auVar62 = vroundss_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),9);
  auVar62 = vminss_avx(auVar62,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar42 = vmaxss_avx512f(auVar120._0_16_,auVar62);
  iVar23 = (int)auVar42._0_4_;
  lVar29 = (long)iVar23 * 0x38;
  lVar11 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar29);
  auVar62 = *(undefined1 (*) [16])(lVar11 + (ulong)*(uint *)(uVar30 + lVar31) * 4);
  uVar27 = (ulong)*(uint *)(uVar30 + 0x10 + lVar31);
  auVar39 = *(undefined1 (*) [16])(lVar11 + uVar27 * 4);
  uVar28 = (ulong)*(uint *)(uVar30 + 0x20 + lVar31);
  auVar40 = *(undefined1 (*) [16])(lVar11 + uVar28 * 4);
  uVar32 = (ulong)*(uint *)(uVar30 + 0x30 + lVar31);
  auVar41 = *(undefined1 (*) [16])(lVar11 + uVar32 * 4);
  uVar24 = (ulong)*(uint *)(uVar30 + 4 + lVar31);
  lVar25 = (long)(iVar23 + 1) * 0x38;
  lVar11 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar25);
  auVar55 = *(undefined1 (*) [16])(lVar11 + (ulong)*(uint *)(uVar30 + lVar31) * 4);
  auVar38 = *(undefined1 (*) [16])(lVar11 + uVar27 * 4);
  lVar12 = *(long *)&pRVar9[*(uint *)(uVar30 + 0x44 + lVar31)].ptr[2].numPrimitives;
  local_1540._0_8_ = lVar29;
  lVar13 = *(long *)(lVar12 + lVar29);
  auVar47 = *(undefined1 (*) [16])(lVar13 + uVar24 * 4);
  auVar60 = *(undefined1 (*) [16])(lVar11 + uVar28 * 4);
  uVar28 = (ulong)*(uint *)(uVar30 + 0x14 + lVar31);
  auVar49 = *(undefined1 (*) [16])(lVar13 + uVar28 * 4);
  auVar63 = *(undefined1 (*) [16])(lVar11 + uVar32 * 4);
  local_1560._0_8_ = lVar31;
  uVar27 = (ulong)*(uint *)(uVar30 + 0x24 + lVar31);
  auVar52 = *(undefined1 (*) [16])(lVar13 + uVar27 * 4);
  uVar37 = (ulong)*(uint *)(uVar30 + 0x34 + lVar31);
  auVar54 = *(undefined1 (*) [16])(lVar13 + uVar37 * 4);
  lVar11 = *(long *)&pRVar9[*(uint *)(uVar30 + 0x48 + lVar31)].ptr[2].numPrimitives;
  lVar12 = *(long *)(lVar12 + lVar25);
  auVar57 = *(undefined1 (*) [16])(lVar12 + uVar24 * 4);
  lVar13 = *(long *)(lVar11 + lVar29);
  auVar58 = *(undefined1 (*) [16])(lVar12 + uVar28 * 4);
  uVar32 = (ulong)*(uint *)(uVar30 + 8 + lVar31);
  auVar44 = *(undefined1 (*) [16])(lVar13 + uVar32 * 4);
  auVar61 = *(undefined1 (*) [16])(lVar12 + uVar27 * 4);
  uVar24 = (ulong)*(uint *)(uVar30 + 0x18 + lVar31);
  auVar48 = *(undefined1 (*) [16])(lVar13 + uVar24 * 4);
  auVar64 = *(undefined1 (*) [16])(lVar12 + uVar37 * 4);
  uVar28 = (ulong)*(uint *)(uVar30 + 0x28 + lVar31);
  auVar51 = *(undefined1 (*) [16])(lVar13 + uVar28 * 4);
  uVar37 = (ulong)*(uint *)(uVar30 + 0x38 + lVar31);
  auVar53 = *(undefined1 (*) [16])(lVar13 + uVar37 * 4);
  lVar11 = *(long *)(lVar11 + lVar25);
  auVar56 = *(undefined1 (*) [16])(lVar11 + uVar32 * 4);
  lVar12 = *(long *)&pRVar9[*(uint *)(uVar30 + 0x4c + lVar31)].ptr[2].numPrimitives;
  lVar13 = *(long *)(lVar12 + lVar29);
  auVar59 = *(undefined1 (*) [16])(lVar11 + uVar24 * 4);
  uVar27 = (ulong)*(uint *)(uVar30 + 0xc + lVar31);
  auVar46 = *(undefined1 (*) [16])(lVar13 + uVar27 * 4);
  auVar93 = *(undefined1 (*) [16])(lVar11 + uVar28 * 4);
  uVar32 = (ulong)*(uint *)(uVar30 + 0x1c + lVar31);
  auVar50 = *(undefined1 (*) [16])(lVar13 + uVar32 * 4);
  auVar43 = vunpcklps_avx512vl(auVar62,auVar44);
  auVar44 = vunpckhps_avx512vl(auVar62,auVar44);
  auVar45 = vunpcklps_avx512vl(auVar47,auVar46);
  auVar47 = vunpckhps_avx(auVar47,auVar46);
  auVar62 = *(undefined1 (*) [16])(lVar11 + uVar37 * 4);
  uVar24 = (ulong)*(uint *)(uVar30 + 0x2c + lVar31);
  auVar44 = vunpcklps_avx(auVar44,auVar47);
  auVar46 = vunpcklps_avx512vl(auVar43,auVar45);
  auVar43 = vunpckhps_avx512vl(auVar43,auVar45);
  auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar47 = vunpcklps_avx512vl(auVar39,auVar48);
  auVar48 = vunpckhps_avx512vl(auVar39,auVar48);
  auVar45 = vunpcklps_avx512vl(auVar49,auVar50);
  auVar49 = vunpckhps_avx512vl(auVar49,auVar50);
  auVar39 = *(undefined1 (*) [16])(lVar13 + uVar24 * 4);
  uVar28 = (ulong)*(uint *)(uVar30 + 0x3c + lVar31);
  auVar49 = vunpcklps_avx(auVar48,auVar49);
  auVar48 = vunpcklps_avx512vl(auVar47,auVar45);
  auVar47 = vunpckhps_avx(auVar47,auVar45);
  auVar50 = vunpcklps_avx512vl(auVar40,auVar51);
  auVar40 = vunpckhps_avx512vl(auVar40,auVar51);
  auVar51 = vunpcklps_avx512vl(auVar52,auVar39);
  auVar52 = vunpckhps_avx512vl(auVar52,auVar39);
  auVar39 = *(undefined1 (*) [16])(lVar13 + uVar28 * 4);
  lVar11 = *(long *)(lVar12 + lVar25);
  auVar52 = vunpcklps_avx(auVar40,auVar52);
  auVar45 = vunpcklps_avx512vl(auVar50,auVar51);
  auVar40 = vunpckhps_avx(auVar50,auVar51);
  auVar51 = vunpcklps_avx512vl(auVar41,auVar53);
  auVar41 = vunpckhps_avx512vl(auVar41,auVar53);
  auVar53 = vunpcklps_avx512vl(auVar54,auVar39);
  auVar54 = vunpckhps_avx512vl(auVar54,auVar39);
  auVar39 = *(undefined1 (*) [16])(lVar11 + uVar27 * 4);
  auVar41 = vunpcklps_avx(auVar41,auVar54);
  auVar54 = vunpcklps_avx512vl(auVar51,auVar53);
  auVar51 = vunpckhps_avx512vl(auVar51,auVar53);
  auVar53 = vunpcklps_avx512vl(auVar55,auVar56);
  auVar55 = vunpckhps_avx512vl(auVar55,auVar56);
  auVar56 = vunpcklps_avx512vl(auVar57,auVar39);
  auVar57 = vunpckhps_avx512vl(auVar57,auVar39);
  auVar39 = *(undefined1 (*) [16])(lVar11 + uVar32 * 4);
  auVar57 = vunpcklps_avx512vl(auVar55,auVar57);
  auVar50 = vunpcklps_avx512vl(auVar53,auVar56);
  auVar53 = vunpckhps_avx512vl(auVar53,auVar56);
  auVar56 = vunpcklps_avx512vl(auVar38,auVar59);
  auVar55 = vunpckhps_avx512vl(auVar38,auVar59);
  auVar38 = vunpcklps_avx512vl(auVar58,auVar39);
  auVar58 = vunpckhps_avx512vl(auVar58,auVar39);
  auVar39 = *(undefined1 (*) [16])(lVar11 + uVar24 * 4);
  auVar55 = vunpcklps_avx(auVar55,auVar58);
  auVar58 = vunpcklps_avx512vl(auVar56,auVar38);
  auVar56 = vunpckhps_avx512vl(auVar56,auVar38);
  auVar59 = vunpcklps_avx512vl(auVar60,auVar93);
  auVar38 = vunpckhps_avx512vl(auVar60,auVar93);
  auVar60 = vunpcklps_avx512vl(auVar61,auVar39);
  auVar61 = vunpckhps_avx512vl(auVar61,auVar39);
  auVar39 = *(undefined1 (*) [16])(lVar11 + uVar28 * 4);
  auVar38 = vunpcklps_avx(auVar38,auVar61);
  auVar61 = vunpcklps_avx512vl(auVar59,auVar60);
  auVar60 = vunpckhps_avx512vl(auVar59,auVar60);
  auVar59 = vunpcklps_avx512vl(auVar63,auVar62);
  auVar62 = vunpckhps_avx512vl(auVar63,auVar62);
  auVar63 = vunpcklps_avx512vl(auVar64,auVar39);
  auVar39 = vunpckhps_avx512vl(auVar64,auVar39);
  auVar62 = vunpcklps_avx(auVar62,auVar39);
  auVar64 = vunpcklps_avx512vl(auVar59,auVar63);
  auVar63 = vunpckhps_avx512vl(auVar59,auVar63);
  auVar39 = ZEXT416((uint)(fVar101 - auVar42._0_4_));
  auVar59 = vbroadcastss_avx512vl(auVar39);
  auVar39 = vsubss_avx512f(ZEXT416(0x3f800000),auVar39);
  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar93._0_4_ = auVar39._0_4_;
  auVar93._4_4_ = auVar93._0_4_;
  auVar93._8_4_ = auVar93._0_4_;
  auVar93._12_4_ = auVar93._0_4_;
  auVar39 = vmulps_avx512vl(auVar59,auVar50);
  auVar46 = vfmadd231ps_avx512vl(auVar39,auVar93,auVar46);
  auVar39 = vmulps_avx512vl(auVar59,auVar53);
  auVar53 = vfmadd231ps_avx512vl(auVar39,auVar93,auVar43);
  auVar39 = vmulps_avx512vl(auVar59,auVar57);
  auVar39 = vfmadd231ps_fma(auVar39,auVar93,auVar44);
  auVar57 = vmulps_avx512vl(auVar59,auVar58);
  auVar58 = vmulps_avx512vl(auVar59,auVar56);
  auVar44 = vmulps_avx512vl(auVar59,auVar55);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar93,auVar48);
  auVar55 = vfmadd231ps_fma(auVar58,auVar93,auVar47);
  auVar47 = vfmadd231ps_fma(auVar44,auVar93,auVar49);
  auVar49 = vmulps_avx512vl(auVar59,auVar61);
  auVar60 = vmulps_avx512vl(auVar59,auVar60);
  auVar38 = vmulps_avx512vl(auVar59,auVar38);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar93,auVar45);
  auVar40 = vfmadd231ps_fma(auVar60,auVar93,auVar40);
  auVar38 = vfmadd231ps_fma(auVar38,auVar93,auVar52);
  auVar60 = vmulps_avx512vl(auVar59,auVar64);
  auVar63 = vmulps_avx512vl(auVar59,auVar63);
  auVar52 = vmulps_avx512vl(auVar59,auVar62);
  auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar62 = vfmadd231ps_fma(auVar60,auVar93,auVar54);
  auVar60 = vfmadd231ps_fma(auVar63,auVar93,auVar51);
  auVar41 = vfmadd231ps_fma(auVar52,auVar93,auVar41);
  auVar65 = vinsertf32x4_avx512vl(ZEXT1632(auVar46),auVar49,1);
  auVar66 = vinsertf32x4_avx512vl(ZEXT1632(auVar53),auVar40,1);
  auVar73._16_16_ = auVar38;
  auVar73._0_16_ = auVar39;
  auVar75._16_16_ = auVar57;
  auVar75._0_16_ = auVar57;
  auVar78._16_16_ = auVar55;
  auVar78._0_16_ = auVar55;
  auVar76._16_16_ = auVar47;
  auVar76._0_16_ = auVar47;
  auVar80._16_16_ = auVar62;
  auVar80._0_16_ = auVar62;
  auVar77._16_16_ = auVar60;
  auVar77._0_16_ = auVar60;
  uVar91 = *(undefined4 *)&(ray->org).field_0;
  auVar81._4_4_ = uVar91;
  auVar81._0_4_ = uVar91;
  auVar81._8_4_ = uVar91;
  auVar81._12_4_ = uVar91;
  auVar81._16_4_ = uVar91;
  auVar81._20_4_ = uVar91;
  auVar81._24_4_ = uVar91;
  auVar81._28_4_ = uVar91;
  auVar71 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
  auVar67 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
  uVar91 = *(undefined4 *)&(ray->dir).field_0;
  auVar95._4_4_ = uVar91;
  auVar95._0_4_ = uVar91;
  auVar95._8_4_ = uVar91;
  auVar95._12_4_ = uVar91;
  auVar95._16_4_ = uVar91;
  auVar95._20_4_ = uVar91;
  auVar95._24_4_ = uVar91;
  auVar95._28_4_ = uVar91;
  uVar91 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  auVar97._4_4_ = uVar91;
  auVar97._0_4_ = uVar91;
  auVar97._8_4_ = uVar91;
  auVar97._12_4_ = uVar91;
  auVar97._16_4_ = uVar91;
  auVar97._20_4_ = uVar91;
  auVar97._24_4_ = uVar91;
  auVar97._28_4_ = uVar91;
  auVar79._16_16_ = auVar41;
  auVar79._0_16_ = auVar41;
  fVar7 = (ray->dir).field_0.m128[2];
  auVar107._4_4_ = fVar7;
  auVar107._0_4_ = fVar7;
  auVar107._8_4_ = fVar7;
  auVar107._12_4_ = fVar7;
  auVar107._16_4_ = fVar7;
  auVar107._20_4_ = fVar7;
  auVar107._24_4_ = fVar7;
  auVar107._28_4_ = fVar7;
  auVar65 = vsubps_avx(auVar65,auVar81);
  auVar72 = vsubps_avx512vl(auVar66,auVar71);
  auVar73 = vsubps_avx512vl(auVar73,auVar67);
  auVar74 = vsubps_avx512vl(auVar75,auVar81);
  auVar75 = vsubps_avx512vl(auVar78,auVar71);
  auVar76 = vsubps_avx512vl(auVar76,auVar67);
  auVar66 = vsubps_avx(auVar80,auVar81);
  auVar77 = vsubps_avx512vl(auVar77,auVar71);
  auVar67 = vsubps_avx512vl(auVar79,auVar67);
  auVar71 = vsubps_avx(auVar66,auVar65);
  auVar78 = vsubps_avx512vl(auVar77,auVar72);
  auVar79 = vsubps_avx512vl(auVar67,auVar73);
  auVar80 = vsubps_avx512vl(auVar65,auVar74);
  auVar81 = vsubps_avx512vl(auVar72,auVar75);
  auVar82 = vsubps_avx512vl(auVar73,auVar76);
  auVar87._0_4_ = auVar66._0_4_ + auVar65._0_4_;
  auVar87._4_4_ = auVar66._4_4_ + auVar65._4_4_;
  auVar87._8_4_ = auVar66._8_4_ + auVar65._8_4_;
  auVar87._12_4_ = auVar66._12_4_ + auVar65._12_4_;
  auVar87._16_4_ = auVar66._16_4_ + auVar65._16_4_;
  auVar87._20_4_ = auVar66._20_4_ + auVar65._20_4_;
  auVar87._24_4_ = auVar66._24_4_ + auVar65._24_4_;
  auVar87._28_4_ = auVar66._28_4_ + auVar65._28_4_;
  auVar83 = vaddps_avx512vl(auVar77,auVar72);
  auVar84 = vaddps_avx512vl(auVar67,auVar73);
  auVar85._4_4_ = auVar79._4_4_ * auVar83._4_4_;
  auVar85._0_4_ = auVar79._0_4_ * auVar83._0_4_;
  auVar85._8_4_ = auVar79._8_4_ * auVar83._8_4_;
  auVar85._12_4_ = auVar79._12_4_ * auVar83._12_4_;
  auVar85._16_4_ = auVar79._16_4_ * auVar83._16_4_;
  auVar85._20_4_ = auVar79._20_4_ * auVar83._20_4_;
  auVar85._24_4_ = auVar79._24_4_ * auVar83._24_4_;
  auVar85._28_4_ = auVar47._12_4_;
  auVar39 = vfmsub231ps_fma(auVar85,auVar78,auVar84);
  auVar86._4_4_ = auVar71._4_4_ * auVar84._4_4_;
  auVar86._0_4_ = auVar71._0_4_ * auVar84._0_4_;
  auVar86._8_4_ = auVar71._8_4_ * auVar84._8_4_;
  auVar86._12_4_ = auVar71._12_4_ * auVar84._12_4_;
  auVar86._16_4_ = auVar71._16_4_ * auVar84._16_4_;
  auVar86._20_4_ = auVar71._20_4_ * auVar84._20_4_;
  auVar86._24_4_ = auVar71._24_4_ * auVar84._24_4_;
  auVar86._28_4_ = auVar84._28_4_;
  auVar62 = vfmsub231ps_fma(auVar86,auVar79,auVar87);
  auVar84._4_4_ = auVar78._4_4_ * auVar87._4_4_;
  auVar84._0_4_ = auVar78._0_4_ * auVar87._0_4_;
  auVar84._8_4_ = auVar78._8_4_ * auVar87._8_4_;
  auVar84._12_4_ = auVar78._12_4_ * auVar87._12_4_;
  auVar84._16_4_ = auVar78._16_4_ * auVar87._16_4_;
  auVar84._20_4_ = auVar78._20_4_ * auVar87._20_4_;
  auVar84._24_4_ = auVar78._24_4_ * auVar87._24_4_;
  auVar84._28_4_ = auVar87._28_4_;
  auVar40 = vfmsub231ps_fma(auVar84,auVar71,auVar83);
  auVar88._0_4_ = fVar7 * auVar40._0_4_;
  auVar88._4_4_ = fVar7 * auVar40._4_4_;
  auVar88._8_4_ = fVar7 * auVar40._8_4_;
  auVar88._12_4_ = fVar7 * auVar40._12_4_;
  auVar88._16_4_ = fVar7 * 0.0;
  auVar88._20_4_ = fVar7 * 0.0;
  auVar88._24_4_ = fVar7 * 0.0;
  auVar88._28_4_ = 0;
  auVar62 = vfmadd231ps_fma(auVar88,auVar97,ZEXT1632(auVar62));
  auVar62 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar95,ZEXT1632(auVar39));
  auVar85 = vaddps_avx512vl(auVar65,auVar74);
  auVar86 = vaddps_avx512vl(auVar72,auVar75);
  auVar84 = vaddps_avx512vl(auVar73,auVar76);
  auVar83 = vmulps_avx512vl(auVar86,auVar82);
  auVar87 = vfmsub231ps_avx512vl(auVar83,auVar81,auVar84);
  auVar83._4_4_ = auVar84._4_4_ * auVar80._4_4_;
  auVar83._0_4_ = auVar84._0_4_ * auVar80._0_4_;
  auVar83._8_4_ = auVar84._8_4_ * auVar80._8_4_;
  auVar83._12_4_ = auVar84._12_4_ * auVar80._12_4_;
  auVar83._16_4_ = auVar84._16_4_ * auVar80._16_4_;
  auVar83._20_4_ = auVar84._20_4_ * auVar80._20_4_;
  auVar83._24_4_ = auVar84._24_4_ * auVar80._24_4_;
  auVar83._28_4_ = auVar84._28_4_;
  auVar84 = vfmsub231ps_avx512vl(auVar83,auVar82,auVar85);
  auVar85 = vmulps_avx512vl(auVar85,auVar81);
  auVar39 = vfmsub231ps_fma(auVar85,auVar80,auVar86);
  auVar85 = vsubps_avx512vl(auVar74,auVar66);
  auVar109._0_4_ = fVar7 * auVar39._0_4_;
  auVar109._4_4_ = fVar7 * auVar39._4_4_;
  auVar109._8_4_ = fVar7 * auVar39._8_4_;
  auVar109._12_4_ = fVar7 * auVar39._12_4_;
  auVar109._16_4_ = fVar7 * 0.0;
  auVar109._20_4_ = fVar7 * 0.0;
  auVar109._24_4_ = fVar7 * 0.0;
  auVar109._28_4_ = 0;
  auVar39 = vfmadd231ps_fma(auVar109,auVar97,auVar84);
  auVar86 = vsubps_avx512vl(auVar75,auVar77);
  local_13a0 = vfmadd231ps_avx512vl(ZEXT1632(auVar39),auVar95,auVar87);
  auVar84 = vsubps_avx512vl(auVar76,auVar67);
  auVar66 = vaddps_avx512vl(auVar74,auVar66);
  auVar83 = vaddps_avx512vl(auVar75,auVar77);
  auVar67 = vaddps_avx512vl(auVar76,auVar67);
  auVar74 = vmulps_avx512vl(auVar83,auVar84);
  auVar75 = vfmsub231ps_avx512vl(auVar74,auVar86,auVar67);
  auVar67 = vmulps_avx512vl(auVar67,auVar85);
  auVar67 = vfmsub231ps_avx512vl(auVar67,auVar84,auVar66);
  auVar74._4_4_ = auVar66._4_4_ * auVar86._4_4_;
  auVar74._0_4_ = auVar66._0_4_ * auVar86._0_4_;
  auVar74._8_4_ = auVar66._8_4_ * auVar86._8_4_;
  auVar74._12_4_ = auVar66._12_4_ * auVar86._12_4_;
  auVar74._16_4_ = auVar66._16_4_ * auVar86._16_4_;
  auVar74._20_4_ = auVar66._20_4_ * auVar86._20_4_;
  auVar74._24_4_ = auVar66._24_4_ * auVar86._24_4_;
  auVar74._28_4_ = auVar66._28_4_;
  auVar66 = vfmsub231ps_avx512vl(auVar74,auVar85,auVar83);
  auVar66 = vmulps_avx512vl(auVar107,auVar66);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar97,auVar67);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar95,auVar75);
  auVar119._0_4_ = local_13a0._0_4_ + auVar62._0_4_;
  auVar119._4_4_ = local_13a0._4_4_ + auVar62._4_4_;
  auVar119._8_4_ = local_13a0._8_4_ + auVar62._8_4_;
  auVar119._12_4_ = local_13a0._12_4_ + auVar62._12_4_;
  auVar119._16_4_ = local_13a0._16_4_ + 0.0;
  auVar119._20_4_ = local_13a0._20_4_ + 0.0;
  auVar119._24_4_ = local_13a0._24_4_ + 0.0;
  auVar119._28_4_ = local_13a0._28_4_ + 0.0;
  local_1380 = vaddps_avx512vl(auVar66,auVar119);
  vandps_avx512vl(local_1380,auVar70);
  auVar67._8_4_ = 0x34000000;
  auVar67._0_8_ = 0x3400000034000000;
  auVar67._12_4_ = 0x34000000;
  auVar67._16_4_ = 0x34000000;
  auVar67._20_4_ = 0x34000000;
  auVar67._24_4_ = 0x34000000;
  auVar67._28_4_ = 0x34000000;
  auVar67 = vmulps_avx512vl(local_1380,auVar67);
  auVar83 = vminps_avx512vl(ZEXT1632(auVar62),local_13a0);
  auVar83 = vminps_avx512vl(auVar83,auVar66);
  auVar74 = vxorps_avx512vl(auVar67,auVar69);
  uVar94 = vcmpps_avx512vl(auVar83,auVar74,5);
  auVar83 = vmaxps_avx512vl(ZEXT1632(auVar62),local_13a0);
  auVar66 = vmaxps_avx512vl(auVar83,auVar66);
  uVar15 = vcmpps_avx512vl(auVar66,auVar67,2);
  auVar66 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x10 + lVar31));
  local_13e0 = vmovdqa64_avx512vl(auVar66);
  auVar66 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x14 + lVar31));
  local_1400 = vmovdqa64_avx512vl(auVar66);
  local_1300 = (byte)uVar94 | (byte)uVar15;
  fVar101 = fStack_143c;
  fVar102 = fStack_1438;
  fVar103 = fStack_1434;
  fVar104 = fStack_1430;
  fVar105 = fStack_142c;
  fVar106 = fStack_1428;
  fVar92 = local_1440;
  fVar111 = fStack_149c;
  fVar112 = fStack_1498;
  fVar113 = fStack_1494;
  fVar114 = fStack_1490;
  fVar115 = fStack_148c;
  fVar116 = fStack_1488;
  fVar90 = local_14a0;
  if (local_1300 == 0) {
LAB_01c73b22:
    auVar100 = ZEXT3264(local_1420);
    auVar108 = ZEXT3264(local_1460);
    auVar110 = ZEXT3264(local_1480);
    auVar117 = ZEXT3264(local_14c0);
    auVar99 = ZEXT3264(local_14e0);
    auVar96 = ZEXT3264(local_1500);
    auVar118 = ZEXT3264(local_1520);
  }
  else {
    auVar66 = vmulps_avx512vl(auVar79,auVar81);
    auVar67 = vmulps_avx512vl(auVar71,auVar82);
    auVar83 = vmulps_avx512vl(auVar78,auVar80);
    auVar74 = vmulps_avx512vl(auVar82,auVar86);
    auVar75 = vmulps_avx512vl(auVar80,auVar84);
    auVar76 = vmulps_avx512vl(auVar81,auVar85);
    auVar77 = vfmsub213ps_avx512vl(auVar78,auVar82,auVar66);
    auVar78 = vfmsub213ps_avx512vl(auVar79,auVar80,auVar67);
    auVar71 = vfmsub213ps_avx512vl(auVar71,auVar81,auVar83);
    auVar84 = vfmsub213ps_avx512vl(auVar84,auVar81,auVar74);
    auVar85 = vfmsub213ps_avx512vl(auVar85,auVar82,auVar75);
    auVar86 = vfmsub213ps_avx512vl(auVar86,auVar80,auVar76);
    vandps_avx512vl(auVar66,auVar70);
    vandps_avx512vl(auVar74,auVar70);
    uVar24 = vcmpps_avx512vl(auVar86,auVar86,1);
    vandps_avx512vl(auVar67,auVar70);
    vandps_avx512vl(auVar75,auVar70);
    uVar27 = vcmpps_avx512vl(auVar86,auVar86,1);
    vandps_avx512vl(auVar83,auVar70);
    vandps_avx512vl(auVar76,auVar70);
    uVar28 = vcmpps_avx512vl(auVar86,auVar86,1);
    bVar14 = (bool)((byte)uVar24 & 1);
    local_1360._0_4_ = (float)((uint)bVar14 * auVar77._0_4_ | (uint)!bVar14 * auVar84._0_4_);
    bVar14 = (bool)((byte)(uVar24 >> 1) & 1);
    local_1360._4_4_ = (float)((uint)bVar14 * auVar77._4_4_ | (uint)!bVar14 * auVar84._4_4_);
    bVar14 = (bool)((byte)(uVar24 >> 2) & 1);
    local_1360._8_4_ = (float)((uint)bVar14 * auVar77._8_4_ | (uint)!bVar14 * auVar84._8_4_);
    bVar14 = (bool)((byte)(uVar24 >> 3) & 1);
    local_1360._12_4_ = (float)((uint)bVar14 * auVar77._12_4_ | (uint)!bVar14 * auVar84._12_4_);
    bVar14 = (bool)((byte)(uVar24 >> 4) & 1);
    local_1360._16_4_ = (float)((uint)bVar14 * auVar77._16_4_ | (uint)!bVar14 * auVar84._16_4_);
    bVar14 = (bool)((byte)(uVar24 >> 5) & 1);
    local_1360._20_4_ = (float)((uint)bVar14 * auVar77._20_4_ | (uint)!bVar14 * auVar84._20_4_);
    bVar14 = (bool)((byte)(uVar24 >> 6) & 1);
    local_1360._24_4_ = (float)((uint)bVar14 * auVar77._24_4_ | (uint)!bVar14 * auVar84._24_4_);
    bVar14 = SUB81(uVar24 >> 7,0);
    local_1360._28_4_ = (uint)bVar14 * auVar77._28_4_ | (uint)!bVar14 * auVar84._28_4_;
    bVar14 = (bool)((byte)uVar27 & 1);
    local_1340._0_4_ = (float)((uint)bVar14 * auVar78._0_4_ | (uint)!bVar14 * auVar85._0_4_);
    bVar14 = (bool)((byte)(uVar27 >> 1) & 1);
    local_1340._4_4_ = (float)((uint)bVar14 * auVar78._4_4_ | (uint)!bVar14 * auVar85._4_4_);
    bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
    local_1340._8_4_ = (float)((uint)bVar14 * auVar78._8_4_ | (uint)!bVar14 * auVar85._8_4_);
    bVar14 = (bool)((byte)(uVar27 >> 3) & 1);
    local_1340._12_4_ = (float)((uint)bVar14 * auVar78._12_4_ | (uint)!bVar14 * auVar85._12_4_);
    bVar14 = (bool)((byte)(uVar27 >> 4) & 1);
    local_1340._16_4_ = (float)((uint)bVar14 * auVar78._16_4_ | (uint)!bVar14 * auVar85._16_4_);
    bVar14 = (bool)((byte)(uVar27 >> 5) & 1);
    local_1340._20_4_ = (float)((uint)bVar14 * auVar78._20_4_ | (uint)!bVar14 * auVar85._20_4_);
    bVar14 = (bool)((byte)(uVar27 >> 6) & 1);
    local_1340._24_4_ = (float)((uint)bVar14 * auVar78._24_4_ | (uint)!bVar14 * auVar85._24_4_);
    bVar14 = SUB81(uVar27 >> 7,0);
    local_1340._28_4_ = (uint)bVar14 * auVar78._28_4_ | (uint)!bVar14 * auVar85._28_4_;
    bVar14 = (bool)((byte)uVar28 & 1);
    local_1320 = (float)((uint)bVar14 * auVar71._0_4_ | (uint)!bVar14 * auVar86._0_4_);
    bVar14 = (bool)((byte)(uVar28 >> 1) & 1);
    fStack_131c = (float)((uint)bVar14 * auVar71._4_4_ | (uint)!bVar14 * auVar86._4_4_);
    bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
    fStack_1318 = (float)((uint)bVar14 * auVar71._8_4_ | (uint)!bVar14 * auVar86._8_4_);
    bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
    fStack_1314 = (float)((uint)bVar14 * auVar71._12_4_ | (uint)!bVar14 * auVar86._12_4_);
    bVar14 = (bool)((byte)(uVar28 >> 4) & 1);
    fStack_1310 = (float)((uint)bVar14 * auVar71._16_4_ | (uint)!bVar14 * auVar86._16_4_);
    bVar14 = (bool)((byte)(uVar28 >> 5) & 1);
    fStack_130c = (float)((uint)bVar14 * auVar71._20_4_ | (uint)!bVar14 * auVar86._20_4_);
    bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
    fStack_1308 = (float)((uint)bVar14 * auVar71._24_4_ | (uint)!bVar14 * auVar86._24_4_);
    bVar14 = SUB81(uVar28 >> 7,0);
    auVar82._4_4_ = fVar7 * fStack_131c;
    auVar82._0_4_ = fVar7 * local_1320;
    auVar82._8_4_ = fVar7 * fStack_1318;
    auVar82._12_4_ = fVar7 * fStack_1314;
    auVar82._16_4_ = fVar7 * fStack_1310;
    auVar82._20_4_ = fVar7 * fStack_130c;
    auVar82._24_4_ = fVar7 * fStack_1308;
    auVar82._28_4_ = fVar7;
    auVar39 = vfmadd213ps_fma(auVar97,local_1340,auVar82);
    auVar39 = vfmadd213ps_fma(auVar95,local_1360,ZEXT1632(auVar39));
    auVar67 = ZEXT1632(CONCAT412(auVar39._12_4_ + auVar39._12_4_,
                                 CONCAT48(auVar39._8_4_ + auVar39._8_4_,
                                          CONCAT44(auVar39._4_4_ + auVar39._4_4_,
                                                   auVar39._0_4_ + auVar39._0_4_))));
    auVar98._0_4_ = auVar73._0_4_ * local_1320;
    auVar98._4_4_ = auVar73._4_4_ * fStack_131c;
    auVar98._8_4_ = auVar73._8_4_ * fStack_1318;
    auVar98._12_4_ = auVar73._12_4_ * fStack_1314;
    auVar98._16_4_ = auVar73._16_4_ * fStack_1310;
    auVar98._20_4_ = auVar73._20_4_ * fStack_130c;
    auVar98._24_4_ = auVar73._24_4_ * fStack_1308;
    auVar98._28_4_ = 0;
    auVar39 = vfmadd213ps_fma(auVar72,local_1340,auVar98);
    auVar40 = vfmadd213ps_fma(auVar65,local_1360,ZEXT1632(auVar39));
    auVar65 = vrcp14ps_avx512vl(auVar67);
    auVar66 = vfnmadd213ps_avx512vl(auVar65,auVar67,auVar68);
    auVar39 = vfmadd132ps_fma(auVar66,auVar65,auVar65);
    local_12a0 = ZEXT1632(CONCAT412((auVar40._12_4_ + auVar40._12_4_) * auVar39._12_4_,
                                    CONCAT48((auVar40._8_4_ + auVar40._8_4_) * auVar39._8_4_,
                                             CONCAT44((auVar40._4_4_ + auVar40._4_4_) *
                                                      auVar39._4_4_,
                                                      (auVar40._0_4_ + auVar40._0_4_) *
                                                      auVar39._0_4_))));
    uVar91 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar70._4_4_ = uVar91;
    auVar70._0_4_ = uVar91;
    auVar70._8_4_ = uVar91;
    auVar70._12_4_ = uVar91;
    auVar70._16_4_ = uVar91;
    auVar70._20_4_ = uVar91;
    auVar70._24_4_ = uVar91;
    auVar70._28_4_ = uVar91;
    uVar94 = vcmpps_avx512vl(local_12a0,auVar70,0xd);
    auVar65 = vxorps_avx512vl(auVar67,auVar69);
    fVar7 = ray->tfar;
    auVar69._4_4_ = fVar7;
    auVar69._0_4_ = fVar7;
    auVar69._8_4_ = fVar7;
    auVar69._12_4_ = fVar7;
    auVar69._16_4_ = fVar7;
    auVar69._20_4_ = fVar7;
    auVar69._24_4_ = fVar7;
    auVar69._28_4_ = fVar7;
    uVar15 = vcmpps_avx512vl(local_12a0,auVar69,2);
    uVar16 = vcmpps_avx512vl(auVar67,auVar65,4);
    local_1300 = (byte)uVar94 & (byte)uVar15 & (byte)uVar16 & local_1300;
    if (local_1300 == 0) goto LAB_01c73b22;
    local_13c0 = ZEXT1632(auVar62);
    uStack_1304 = (uint)bVar14 * auVar71._28_4_ | (uint)!bVar14 * auVar86._28_4_;
    local_1220 = 0xf0;
    auVar72._8_4_ = 0x219392ef;
    auVar72._0_8_ = 0x219392ef219392ef;
    auVar72._12_4_ = 0x219392ef;
    auVar72._16_4_ = 0x219392ef;
    auVar72._20_4_ = 0x219392ef;
    auVar72._24_4_ = 0x219392ef;
    auVar72._28_4_ = 0x219392ef;
    uVar24 = vcmpps_avx512vl(local_1380,auVar72,5);
    auVar65 = vrcp14ps_avx512vl(local_1380);
    auVar66 = vfnmadd213ps_avx512vl(local_1380,auVar65,auVar68);
    auVar66 = vfmadd132ps_avx512vl(auVar66,auVar65,auVar65);
    fVar1 = (float)((uint)((byte)uVar24 & 1) * auVar66._0_4_);
    fVar7 = (float)((uint)((byte)(uVar24 >> 1) & 1) * auVar66._4_4_);
    fVar2 = (float)((uint)((byte)(uVar24 >> 2) & 1) * auVar66._8_4_);
    fVar3 = (float)((uint)((byte)(uVar24 >> 3) & 1) * auVar66._12_4_);
    fVar4 = (float)((uint)((byte)(uVar24 >> 4) & 1) * auVar66._16_4_);
    fVar5 = (float)((uint)((byte)(uVar24 >> 5) & 1) * auVar66._20_4_);
    fVar6 = (float)((uint)((byte)(uVar24 >> 6) & 1) * auVar66._24_4_);
    auVar89._0_4_ = fVar1 * auVar62._0_4_;
    auVar89._4_4_ = fVar7 * auVar62._4_4_;
    auVar89._8_4_ = fVar2 * auVar62._8_4_;
    auVar89._12_4_ = fVar3 * auVar62._12_4_;
    auVar89._16_4_ = fVar4 * 0.0;
    auVar89._20_4_ = fVar5 * 0.0;
    auVar89._24_4_ = fVar6 * 0.0;
    auVar89._28_4_ = 0;
    auVar66 = vminps_avx512vl(auVar89,auVar68);
    auVar22._4_4_ = local_13a0._4_4_ * fVar7;
    auVar22._0_4_ = local_13a0._0_4_ * fVar1;
    auVar22._8_4_ = local_13a0._8_4_ * fVar2;
    auVar22._12_4_ = local_13a0._12_4_ * fVar3;
    auVar22._16_4_ = local_13a0._16_4_ * fVar4;
    auVar22._20_4_ = local_13a0._20_4_ * fVar5;
    auVar22._24_4_ = local_13a0._24_4_ * fVar6;
    auVar22._28_4_ = auVar65._28_4_;
    auVar65 = vminps_avx512vl(auVar22,auVar68);
    auVar71 = vsubps_avx512vl(auVar68,auVar66);
    auVar67 = vsubps_avx512vl(auVar68,auVar65);
    local_12c0 = vblendps_avx(auVar65,auVar71,0xf0);
    local_12e0 = vblendps_avx(auVar66,auVar67,0xf0);
    local_1280[0] = local_1360._0_4_ * 1.0;
    local_1280[1] = local_1360._4_4_ * 1.0;
    local_1280[2] = local_1360._8_4_ * 1.0;
    local_1280[3] = local_1360._12_4_ * 1.0;
    fStack_1270 = local_1360._16_4_ * -1.0;
    fStack_126c = local_1360._20_4_ * -1.0;
    fStack_1268 = local_1360._24_4_ * -1.0;
    uStack_1264 = local_12e0._28_4_;
    local_1240._4_4_ = fStack_131c * 1.0;
    local_1240._0_4_ = local_1320 * 1.0;
    local_1240._8_4_ = fStack_1318 * 1.0;
    local_1240._12_4_ = fStack_1314 * 1.0;
    local_1240._16_4_ = fStack_1310 * -1.0;
    local_1240._20_4_ = fStack_130c * -1.0;
    local_1240._24_4_ = fStack_1308 * -1.0;
    local_1240._28_4_ = local_12e0._28_4_;
    local_1260[0] = local_1340._0_4_ * 1.0;
    local_1260[1] = local_1340._4_4_ * 1.0;
    local_1260[2] = local_1340._8_4_ * 1.0;
    local_1260[3] = local_1340._12_4_ * 1.0;
    fStack_1250 = local_1340._16_4_ * -1.0;
    fStack_124c = local_1340._20_4_ * -1.0;
    fStack_1248 = local_1340._24_4_ * -1.0;
    uStack_1244 = local_12c0._28_4_;
    uVar24 = (ulong)local_1300;
    auVar100 = ZEXT3264(local_1420);
    auVar108 = ZEXT3264(local_1460);
    auVar110 = ZEXT3264(local_1480);
    auVar117 = ZEXT3264(local_14c0);
    auVar99 = ZEXT3264(local_14e0);
    auVar96 = ZEXT3264(local_1500);
    auVar118 = ZEXT3264(local_1520);
    do {
      auVar62 = auVar120._0_16_;
      uVar27 = 0;
      for (uVar28 = uVar24; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        uVar27 = uVar27 + 1;
      }
      local_15d0 = (pSVar34->geometries).items[*(uint *)(local_13e0 + uVar27 * 4)].ptr;
      if ((local_15d0->mask & ray->mask) != 0) {
        pRVar36 = local_15e0->args;
        if ((pRVar36->filter == (RTCFilterFunctionN)0x0) &&
           (local_15d0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01c73ba9:
          ray->tfar = -INFINITY;
          return;
        }
        local_1560 = auVar122._0_32_;
        local_1540 = auVar121._0_32_;
        uVar28 = (ulong)(uint)((int)uVar27 * 4);
        local_1590.context = local_15e0->user;
        local_15c0 = *(undefined4 *)((long)local_1280 + uVar28);
        local_15bc = *(undefined4 *)((long)local_1260 + uVar28);
        local_15b8 = *(undefined4 *)(local_1240 + uVar28);
        local_15b4 = *(undefined4 *)(local_12e0 + uVar28);
        local_15b0 = *(undefined4 *)(local_12c0 + uVar28);
        local_15ac = *(undefined4 *)(local_1400 + uVar28);
        local_15a8 = *(uint *)(local_13e0 + uVar27 * 4);
        local_15a4 = (local_1590.context)->instID[0];
        local_15a0 = (local_1590.context)->instPrimID[0];
        fVar101 = ray->tfar;
        ray->tfar = *(float *)(local_12a0 + uVar28);
        local_15ec = -1;
        local_1590.valid = &local_15ec;
        local_1590.geometryUserPtr = local_15d0->userPtr;
        local_1590.hit = (RTCHitN *)&local_15c0;
        local_1590.N = 1;
        local_1590.ray = (RTCRayN *)ray;
        if (((local_15d0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
            (local_15d8 = pRVar36, (*local_15d0->occlusionFilterN)(&local_1590),
            pRVar36 = local_15d8, *local_1590.valid != 0)) &&
           ((pRVar36->filter == (RTCFilterFunctionN)0x0 ||
            ((((pRVar36->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
               RTC_RAY_QUERY_FLAG_INCOHERENT && (((local_15d0->field_8).field_0x2 & 0x40) == 0)) ||
             ((*pRVar36->filter)(&local_1590), *local_1590.valid != 0)))))) goto LAB_01c73ba9;
        ray->tfar = fVar101;
        auVar62 = vxorps_avx512vl(auVar62,auVar62);
        auVar120 = ZEXT1664(auVar62);
        auVar121 = ZEXT3264(local_1540);
        auVar122 = ZEXT3264(local_1560);
        auVar100 = ZEXT3264(local_1420);
        auVar108 = ZEXT3264(local_1460);
        auVar110 = ZEXT3264(local_1480);
        auVar117 = ZEXT3264(local_14c0);
        auVar99 = ZEXT3264(local_14e0);
        auVar96 = ZEXT3264(local_1500);
        auVar118 = ZEXT3264(local_1520);
        pSVar34 = local_15e8;
        fVar92 = local_1440;
        fVar101 = fStack_143c;
        fVar102 = fStack_1438;
        fVar103 = fStack_1434;
        fVar104 = fStack_1430;
        fVar105 = fStack_142c;
        fVar106 = fStack_1428;
        fVar90 = local_14a0;
        fVar111 = fStack_149c;
        fVar112 = fStack_1498;
        fVar113 = fStack_1494;
        fVar114 = fStack_1490;
        fVar115 = fStack_148c;
        fVar116 = fStack_1488;
      }
      uVar24 = uVar24 ^ 1L << (uVar27 & 0x3f);
    } while (uVar24 != 0);
  }
  lVar33 = lVar33 + 1;
  goto LAB_01c73001;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }